

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O2

void node::
     index_tree<node::TreeIndexSED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
               (TreeIndexSED *ti,Node<label::StringLabel> *n,LabelDictionary<label::StringLabel> *ld
               ,UnitCostModelLD<label::StringLabel> *cm)

{
  int iVar1;
  int height;
  int subtree_max_depth;
  int start_postorder;
  int start_preorder;
  
  iVar1 = Node<label::StringLabel>::get_tree_size(n);
  (ti->super_Constants).tree_size_ = iVar1;
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PreLToLabelId).prel_to_label_id_,(long)iVar1);
  std::vector<int,_std::allocator<int>_>::resize
            (&(ti->super_PostLToLabelId).postl_to_label_id_,(long)iVar1);
  start_preorder = 0;
  start_postorder = 0;
  subtree_max_depth = 0;
  height = 0;
  index_tree_recursion<node::TreeIndexSED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
            (ti,n,ld,cm,&start_preorder,&start_postorder,0,&subtree_max_depth,0,&height,-1,false);
  return;
}

Assistant:

void index_tree(TreeIndex& ti, const node::Node<Label>& n,
    label::LabelDictionary<Label>& ld, const CostModel& cm) {
  
  int tree_size = n.get_tree_size();
  ti.tree_size_ = tree_size;
  
  // Resize and clear the indexes.
  // TODO: Resizing is not enough for some vectors in case the same TreeIndex
  //       object is used for multiple trees. Old incorrect values may remain
  //       in the vectors.
  if constexpr (std::is_base_of<PostLToSize, TreeIndex>::value) {
    ti.postl_to_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToSize, TreeIndex>::value) {
    ti.prel_to_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToParent, TreeIndex>::value) {
    ti.postl_to_parent_.resize(tree_size);
    std::fill(ti.postl_to_parent_.begin(), ti.postl_to_parent_.end(), -1);
  }
  if constexpr (std::is_base_of<PreLToParent, TreeIndex>::value) {
    ti.prel_to_parent_.resize(tree_size);
    std::fill(ti.prel_to_parent_.begin(), ti.prel_to_parent_.end(), -1);
  }
  if constexpr (std::is_base_of<PostLToPreL, TreeIndex>::value) {
    ti.postl_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPostL, TreeIndex>::value) {
    ti.prel_to_postl_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPreR, TreeIndex>::value) {
    ti.prel_to_prer_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreRToPreL, TreeIndex>::value) {
    ti.prer_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPostR, TreeIndex>::value) {
    ti.prel_to_postr_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToPreL, TreeIndex>::value) {
    ti.postr_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToChildren, TreeIndex>::value) {
    ti.postl_to_children_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToChildren, TreeIndex>::value) {
    ti.prel_to_children_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToLabelId, TreeIndex>::value) {
    ti.prel_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLabelId, TreeIndex>::value) {
    ti.postl_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToType, TreeIndex>::value) {
    ti.postl_to_type_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToLabelId, TreeIndex>::value) {
    ti.postr_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLLD, TreeIndex>::value) {
    ti.postl_to_lld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToLLD, TreeIndex>::value) {
    ti.prel_to_lld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToRLD, TreeIndex>::value) {
    ti.prel_to_rld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToRLD, TreeIndex>::value) {
    ti.postr_to_rld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToDepth, TreeIndex>::value) {
    ti.postl_to_depth_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLCh, TreeIndex>::value) {
    ti.postl_to_lch_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToSubtreeMaxDepth, TreeIndex>::value) {
    ti.postl_to_subtree_max_depth_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToKRAncestor, TreeIndex>::value) {
    ti.postl_to_kr_ancestor_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreToLn, TreeIndex>::value) {
    ti.prel_to_ln_.resize(tree_size);
    ti.prer_to_ln_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToTypeLeft, TreeIndex>::value) {
    ti.prel_to_type_left_.resize(tree_size);
    std::fill(ti.prel_to_type_left_.begin(), ti.prel_to_type_left_.end(), false);
  }
  if constexpr (std::is_base_of<PreLToTypeRight, TreeIndex>::value) {
    ti.prel_to_type_right_.resize(tree_size);
    std::fill(ti.prel_to_type_right_.begin(), ti.prel_to_type_right_.end(), false);
  }
  if constexpr (std::is_base_of<PreLToSpfCost, TreeIndex>::value) {
    ti.prel_to_cost_all_.resize(tree_size);
    std::fill(ti.prel_to_cost_all_.begin(), ti.prel_to_cost_all_.end(), 0);
    ti.prel_to_cost_left_.resize(tree_size);
    std::fill(ti.prel_to_cost_left_.begin(), ti.prel_to_cost_left_.end(), 0);
    ti.prel_to_cost_right_.resize(tree_size);
    std::fill(ti.prel_to_cost_right_.begin(), ti.prel_to_cost_right_.end(), 0);
  }
  if constexpr (std::is_base_of<PreLToSubtreeCost, TreeIndex>::value) {
    ti.prel_to_subtree_del_cost_.resize(tree_size);
    std::fill(ti.prel_to_subtree_del_cost_.begin(), ti.prel_to_subtree_del_cost_.end(), 0.0);
    ti.prel_to_subtree_ins_cost_.resize(tree_size);
    std::fill(ti.prel_to_subtree_ins_cost_.begin(), ti.prel_to_subtree_ins_cost_.end(), 0.0);
  }
  if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
    ti.list_kr_.clear();
  }
  if constexpr (std::is_base_of<InvertedListDepthToPostL, TreeIndex>::value) {
    ti.inverted_list_depth_to_postl_.clear();
  }
  if constexpr (std::is_base_of<InvertedListLabelIdToPostL, TreeIndex>::value) {
    ti.inverted_list_label_id_to_postl_.clear();
  }
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_fav_child_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_left_fav_child_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
    ti.postl_to_height_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToOrderedChildSize, TreeIndex>::value) {
    ti.postl_to_ordered_child_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToFavorableChildOrder, TreeIndex>::value) {
    ti.postl_to_favorder_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLeftSibling, TreeIndex>::value) {
    ti.postl_to_left_sibling_.resize(tree_size);
  }

  // Orders start with '0'. Are modified by the recursive traversal.
  int start_preorder = 0;
  int start_postorder = 0;
  int start_depth = 0;
  int start_height = 0;

  // Maximum input tree depth - the first reference passed to recursion.
  int subtree_max_depth = 0;
  // Initial height.
  int height = 0;
  index_tree_recursion(ti, n, ld, cm, start_preorder, start_postorder,
      start_depth, subtree_max_depth, start_height, height, -1, false);
  
  if constexpr (std::is_base_of<PostLToFavorableChildOrder, TreeIndex>::value) {
    // Compute favorable child order.
    int ts = tree_size - 1;
    int fid = 0;
    fav_child_processing_order(ti, ts, fid);
  }

  if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
    // Add root to kr - not added in the recursion.
    ti.list_kr_.push_back(start_postorder-1);
  }

  if constexpr (std::is_base_of<PostLToKRAncestor, TreeIndex>::value) {
    fill_kr_ancestors(ti.postl_to_kr_ancestor_, ti.postl_to_lch_, ti.list_kr_);
  }

  if constexpr (std::is_base_of<PreToLn, TreeIndex>::value) {
    fill_ln(ti.prel_to_ln_, ti.prer_to_ln_, ti.prel_to_size_, ti.prer_to_prel_);
  }

  if constexpr (std::is_base_of<PostRToRLD, TreeIndex>::value) {
    fill_rld(ti.postr_to_rld_, ti.prel_to_size_, ti.postr_to_prel_,
        ti.prel_to_postr_, ti.prel_to_children_);
  }
}